

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall
QAbstractItemView::setSelectionModel(QAbstractItemView *this,QItemSelectionModel *selectionModel)

{
  bool bVar1;
  QAbstractItemViewPrivate *pQVar2;
  QAbstractItemModel *pQVar3;
  long lVar4;
  long lVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QModelIndex oldCurrentIndex;
  QItemSelection oldSelection;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  Object *in_stack_fffffffffffffe88;
  Connection *this_00;
  QMessageLogger *in_stack_fffffffffffffe90;
  offset_in_QAbstractItemView_to_subr in_stack_fffffffffffffeb0;
  offset_in_QAbstractItemView_to_subr *in_stack_fffffffffffffec0;
  ContextType *in_stack_fffffffffffffec8;
  code *in_stack_fffffffffffffed0;
  code *in_stack_fffffffffffffef0;
  ConnectionType type;
  long *plVar6;
  undefined1 local_e8 [24];
  undefined1 local_d0 [24];
  undefined8 local_b8;
  undefined8 local_b0;
  Connection local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  Connection local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  plVar6 = in_RDI;
  pQVar2 = d_func((QAbstractItemView *)0x8010be);
  type = (ConnectionType)plVar6;
  pQVar3 = (QAbstractItemModel *)QItemSelectionModel::model();
  if (pQVar3 == pQVar2->model) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QItemSelection::QItemSelection((QItemSelection *)0x80115a);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x801194);
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8011a8);
    if (bVar1) {
      QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8011c5);
      lVar4 = QItemSelectionModel::model();
      lVar5 = QItemSelectionModel::model();
      if (lVar4 == lVar5) {
        QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x801204);
        QItemSelectionModel::selection();
        QItemSelection::operator=
                  ((QItemSelection *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (QItemSelection *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        QItemSelection::~QItemSelection((QItemSelection *)0x801236);
        QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x80124a);
        QItemSelectionModel::currentIndex();
        local_58 = local_88;
        local_50 = local_80;
        local_48 = local_78;
      }
      ::QPointer::operator_cast_to_QItemSelectionModel_((QPointer<QItemSelectionModel> *)0x80129e);
      in_stack_fffffffffffffef0 = QItemSelectionModel::selectionChanged;
      QObject::
      disconnect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QAbstractItemView::*)(QItemSelection_const&,QItemSelection_const&)>
                (in_stack_fffffffffffffe88,
                 (offset_in_QItemSelectionModel_to_subr)in_stack_fffffffffffffec0,
                 (Object *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffeb0);
      ::QPointer::operator_cast_to_QItemSelectionModel_((QPointer<QItemSelectionModel> *)0x801300);
      in_stack_fffffffffffffed0 = QItemSelectionModel::currentChanged;
      in_stack_fffffffffffffec8 = (ContextType *)0x0;
      in_stack_fffffffffffffec0 = (offset_in_QAbstractItemView_to_subr *)0x251;
      QObject::
      disconnect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&,QModelIndex_const&)>
                (in_stack_fffffffffffffe88,0x251,
                 (Object *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffeb0);
    }
    QPointer<QItemSelectionModel>::operator=
              ((QPointer<QItemSelectionModel> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (QItemSelectionModel *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
    ;
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x801378);
    if (bVar1) {
      ::QPointer::operator_cast_to_QItemSelectionModel_((QPointer<QItemSelectionModel> *)0x801395);
      local_98 = 0;
      local_a0 = 0x249;
      this_00 = &local_90;
      QObject::
      connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QAbstractItemView::*)(QItemSelection_const&,QItemSelection_const&)>
                ((Object *)in_stack_fffffffffffffed0,
                 (offset_in_QItemSelectionModel_to_subr)in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,type);
      QMetaObject::Connection::~Connection(this_00);
      ::QPointer::operator_cast_to_QItemSelectionModel_((QPointer<QItemSelectionModel> *)0x801415);
      local_b0 = 0;
      local_b8 = 0x251;
      QObject::
      connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QAbstractItemView::*)(QModelIndex_const&,QModelIndex_const&)>
                ((Object *)in_stack_fffffffffffffed0,
                 (offset_in_QItemSelectionModel_to_subr)in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,type);
      QMetaObject::Connection::~Connection(&local_a8);
      QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x801493);
      QItemSelectionModel::selection();
      (**(code **)(*in_RDI + 0x248))(in_RDI,local_d0,&local_40);
      QItemSelection::~QItemSelection((QItemSelection *)0x8014ce);
      QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x8014e2);
      QItemSelectionModel::currentIndex();
      (**(code **)(*in_RDI + 0x250))(in_RDI,local_e8,&local_58);
    }
    QItemSelection::~QItemSelection((QItemSelection *)0x80151d);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe84
               ,(char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    QMessageLogger::warning
              (local_28,
               "QAbstractItemView::setSelectionModel() failed: Trying to set a selection model, which works on a different model than the view."
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::setSelectionModel(QItemSelectionModel *selectionModel)
{
    // ### if the given model is null, we should use the original selection model
    Q_ASSERT(selectionModel);
    Q_D(QAbstractItemView);

    if (Q_UNLIKELY(selectionModel->model() != d->model)) {
        qWarning("QAbstractItemView::setSelectionModel() failed: "
                 "Trying to set a selection model, which works on "
                 "a different model than the view.");
        return;
    }

    QItemSelection oldSelection;
    QModelIndex oldCurrentIndex;

    if (d->selectionModel) {
        if (d->selectionModel->model() == selectionModel->model()) {
            oldSelection = d->selectionModel->selection();
            oldCurrentIndex = d->selectionModel->currentIndex();
        }
        disconnect(d->selectionModel, &QItemSelectionModel::selectionChanged,
                   this, &QAbstractItemView::selectionChanged);
        disconnect(d->selectionModel, &QItemSelectionModel::currentChanged,
                   this, &QAbstractItemView::currentChanged);
    }

    d->selectionModel = selectionModel;

    if (d->selectionModel) {
        connect(d->selectionModel, &QItemSelectionModel::selectionChanged,
                this, &QAbstractItemView::selectionChanged);
        connect(d->selectionModel, &QItemSelectionModel::currentChanged,
                this, &QAbstractItemView::currentChanged);

        selectionChanged(d->selectionModel->selection(), oldSelection);
        currentChanged(d->selectionModel->currentIndex(), oldCurrentIndex);
    }
}